

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v11::detail::format_float<double>
              (double value,int precision,format_specs *specs,bool binary32,buffer<char> *buf)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  basic_fp<unsigned___int128> value_00;
  buffer<char> *pbVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  format_error *this;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int k;
  long lVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  uint128_fallback uVar25;
  int local_7c;
  buffer<char> *local_78;
  undefined4 local_6c;
  double local_68;
  format_specs *local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  uVar13 = (specs->super_basic_specs).data_ & 7;
  if ((value == 0.0) && (!NAN(value))) {
    if (precision < 1 || uVar13 != 2) {
      sVar12 = buf->size_;
      uVar16 = sVar12 + 1;
      if (buf->capacity_ < uVar16) {
        (*buf->grow_)(buf,uVar16);
        sVar12 = buf->size_;
        uVar16 = sVar12 + 1;
      }
      buf->size_ = uVar16;
      buf->ptr_[sVar12] = '0';
      return 0;
    }
    uVar22 = (ulong)(uint)precision;
    uVar16 = buf->capacity_;
    if (uVar16 < uVar22) {
      (*buf->grow_)(buf,uVar22);
      uVar16 = buf->capacity_;
    }
    if (uVar22 < uVar16) {
      uVar16 = uVar22;
    }
    buf->size_ = uVar16;
    memset(buf->ptr_,0x30,uVar22);
    return -precision;
  }
  uVar16 = (ulong)value & 0xfffffffffffff;
  uVar22 = (ulong)value & 0x7ff0000000000000;
  local_6c = (undefined4)CONCAT71(in_register_00000011,binary32);
  uVar17 = (uint)(uVar22 >> 0x20);
  local_78 = buf;
  local_68 = value;
  local_60 = specs;
  if (uVar22 == 0) {
    if (uVar16 == 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format.h"
                  ,0xbe5,"zeros should not appear here");
    }
    uVar20 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    iVar10 = -0x427 - (int)(uVar20 ^ 0x3f);
    lVar19 = uVar16 << ((char)(uVar20 ^ 0x3f) - 10U & 0x3f);
  }
  else {
    iVar10 = (uVar17 >> 0x14) - 0x433;
    lVar19 = uVar16 * 2 + 0x20000000000000;
  }
  iVar21 = iVar10 * 0x4d105 >> 0x14;
  k = 2 - iVar21;
  iVar21 = iVar21 + -2;
  uVar20 = lVar19 << ((char)((uint)(k * 0x1a934f) >> 0x13) + (char)iVar10 & 0x3fU);
  uVar25 = dragonbox::cache_accessor<double>::get_cached_power(k);
  pbVar9 = local_78;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar20;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar25.hi_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar20;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar25.lo_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar3 * auVar7,8);
  auVar8 = auVar2 * auVar6 + auVar8;
  lVar19 = auVar8._0_8_;
  uVar18 = auVar8._8_8_;
  uVar20 = uVar18 * 10;
  if (999999999999999999 < uVar18) {
    uVar20 = uVar18;
  }
  uVar11 = 999999999999999999 < uVar18 | 0x12;
  if (uVar13 == 2) {
    uVar14 = uVar11 + iVar21;
    if ((int)(uVar14 ^ 0x7fffffff) < precision && 0 < (int)uVar14) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::runtime_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    precision = uVar14 + precision;
  }
  if (uVar11 - precision == 0 || (int)uVar11 < precision) {
    local_7c = uVar11 + iVar21 + -1;
    if ((char)local_6c == '\0') {
      local_58 = uVar16 | 0x10000000000000;
      if (uVar22 == 0) {
        local_58 = uVar16;
      }
      local_48 = -0x432;
      if (uVar22 != 0) {
        local_48 = (uVar17 >> 0x14) - 0x433;
      }
      bVar24 = uVar16 == 0;
      bVar23 = uVar22 >> 0x35 != 0;
    }
    else {
      uVar11 = (uint)(float)local_68 & 0x7fffff;
      uVar17 = (uint)(float)local_68 & 0x7f800000;
      local_58 = (ulong)uVar11 + 0x800000;
      if (uVar17 == 0) {
        local_58 = (ulong)uVar11;
      }
      local_48 = -0x95;
      if (uVar17 != 0) {
        local_48 = (uVar17 >> 0x17) - 0x96;
      }
      bVar24 = uVar11 == 0;
      bVar23 = 0xffffff < uVar17;
    }
    uVar17 = (byte)(bVar23 & bVar24) + 4;
    if (uVar13 != 2) {
      uVar17 = (uint)(byte)(bVar23 & bVar24);
    }
    uVar11 = 0x2ff;
    if ((uint)precision < 0x2ff) {
      uVar11 = precision;
    }
    uStack_50 = 0;
    value_00._20_4_ = uStack_44;
    value_00.e = local_48;
    value_00.f._8_8_ = 0;
    value_00.f._0_8_ = local_58;
    value_00._24_8_ = uStack_40;
    format_dragon(value_00,uVar17,uVar11,local_78,&local_7c);
    goto LAB_001e4492;
  }
  if (precision < 1) {
    local_7c = iVar21 + uVar11;
    if (precision < 0) {
      local_78->size_ = 0;
    }
    else {
      uVar16 = 1;
      if (local_78->capacity_ == 0) {
        (*local_78->grow_)(local_78,1);
        uVar16 = (ulong)(pbVar9->capacity_ != 0);
      }
      pbVar9->size_ = uVar16;
      if ((uVar20 | lVar19 != 0) < 0x4563918244f40001) {
        *pbVar9->ptr_ = '0';
      }
      else {
        *pbVar9->ptr_ = '1';
      }
    }
    goto LAB_001e4492;
  }
  local_7c = (uVar11 - precision) + iVar21;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar20;
  uVar16 = SUB168(auVar4 * ZEXT816(0x6df37f675ef6eae0),8) >> 0x20;
  uVar22 = 9;
  if ((uint)precision < 9) {
    uVar22 = (ulong)(uint)precision;
  }
  pcVar1 = local_78->ptr_;
  if ((uVar22 & 1) == 0) {
    uVar18 = (uVar16 * 0x1ad7f29b >> 0x14) + 1;
    uVar15 = uVar18 >> 0x20;
    *(undefined2 *)pcVar1 = *(undefined2 *)(digits2(unsigned_long)::data + uVar15 * 2);
    uVar17 = 2;
  }
  else {
    uVar18 = (uVar16 * 0x2af31dc5 >> 0x18) + 1;
    uVar15 = uVar18 >> 0x20;
    *pcVar1 = (char)(uVar18 >> 0x20) + '0';
    uVar17 = 1;
  }
  uVar20 = uVar16 * -10000000000 + uVar20;
  if (uVar17 < (uint)precision) {
    uVar16 = (ulong)uVar17;
    do {
      uVar18 = (uVar18 & 0xffffffff) * 100;
      uVar15 = uVar18 >> 0x20;
      *(undefined2 *)(pcVar1 + uVar16) = *(undefined2 *)(digits2(unsigned_long)::data + uVar15 * 2);
      uVar16 = uVar16 + 2;
    } while (uVar16 < uVar22);
    if (9 < precision) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar20;
      uVar17 = precision - 9;
      pcVar1 = local_78->ptr_;
      uVar16 = SUB168(auVar5 * ZEXT816(0x199999999999999a),8) & 0xffffffff;
      if ((uVar17 & 1) == 0) {
        uVar18 = (uVar16 * 0x1ad7f29b >> 0x14) + 1;
        uVar16 = uVar18 >> 0x20;
        *(undefined2 *)(pcVar1 + 9) = *(undefined2 *)(digits2(unsigned_long)::data + uVar16 * 2);
        uVar11 = 2;
      }
      else {
        uVar18 = (uVar16 * 0x2af31dc5 >> 0x18) + 1;
        uVar16 = uVar18 >> 0x20;
        pcVar1[9] = (char)(uVar18 >> 0x20) + '0';
        uVar11 = 1;
      }
      uVar14 = (int)uVar20 + SUB164(auVar5 * ZEXT816(0x199999999999999a),8) * -10;
      if (uVar11 < uVar17) {
        uVar22 = (ulong)uVar11;
        do {
          uVar18 = (uVar18 & 0xffffffff) * 100;
          uVar16 = uVar18 >> 0x20;
          *(undefined2 *)(pcVar1 + uVar22 + 9) =
               *(undefined2 *)(digits2(unsigned_long)::data + uVar16 * 2);
          uVar22 = uVar22 + 2;
        } while (uVar22 < uVar17);
        if (0x11 < precision) {
          if (uVar14 < 6) {
            uVar17 = precision;
            if (uVar14 == 5) goto joined_r0x001e4513;
            goto LAB_001e4468;
          }
          goto LAB_001e4402;
        }
      }
      if ((uint)(char32_t)uVar18 < (uint)anon_var_dwarf_4ffda0[0x11 - precision]) {
        uVar17 = (uint)(char32_t)uVar18 >> 0x1f &
                 ((uint)uVar16 | (uint)(uVar14 != 0 || lVar19 != 0));
        goto joined_r0x001e43d6;
      }
      goto LAB_001e43dc;
    }
    if (precision != 9) goto LAB_001e42ac;
    if (5000000000 < uVar20) {
LAB_001e4402:
      local_78->ptr_[(ulong)(uint)precision - 1] =
           local_78->ptr_[(ulong)(uint)precision - 1] + '\x01';
      goto LAB_001e440d;
    }
    uVar17 = 9;
    if (uVar20 == 5000000000) {
joined_r0x001e4513:
      if ((lVar19 != 0) || ((uVar18 & 0x100000000) != 0)) goto LAB_001e4402;
    }
  }
  else {
LAB_001e42ac:
    if ((uint)(char32_t)uVar18 < (uint)anon_var_dwarf_4ffda0[8 - (int)uVar22]) {
      uVar17 = ((uint)uVar15 | (uint)(uVar20 != 0 || lVar19 != 0)) & (uint)(char32_t)uVar18 >> 0x1f;
joined_r0x001e43d6:
      if (uVar17 != 0) goto LAB_001e43dc;
    }
    else {
LAB_001e43dc:
      local_78->ptr_[(ulong)(uint)precision - 1] =
           local_78->ptr_[(ulong)(uint)precision - 1] + '\x01';
      uVar16 = 1;
      if (precision != 1) {
LAB_001e440d:
        uVar16 = (ulong)(uint)precision;
        uVar22 = uVar16 - 1;
        do {
          if (local_78->ptr_[uVar22 & 0xffffffff] < ':') break;
          local_78->ptr_[uVar22 & 0xffffffff] = '0';
          local_78->ptr_[uVar22 - 1] = local_78->ptr_[uVar22 - 1] + '\x01';
          uVar22 = uVar22 - 1;
        } while (2 < (int)uVar22 + 2);
      }
      if ('9' < *local_78->ptr_) {
        *local_78->ptr_ = '1';
        if (uVar13 == 2) {
          precision = precision + 1;
          local_78->ptr_[uVar16] = '0';
        }
        else {
          local_7c = local_7c + 1;
        }
      }
    }
    uVar17 = precision;
    if (precision < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                  ,0x1b6,"negative value");
    }
  }
LAB_001e4468:
  uVar22 = (ulong)uVar17;
  uVar16 = local_78->capacity_;
  if (uVar16 < uVar22) {
    (*local_78->grow_)(local_78,uVar22);
    uVar16 = pbVar9->capacity_;
  }
  if (uVar22 < uVar16) {
    uVar16 = uVar22;
  }
  pbVar9->size_ = uVar16;
LAB_001e4492:
  if ((uVar13 != 2) && (((local_60->super_basic_specs).data_ & 0x2000) == 0)) {
    uVar16 = pbVar9->size_;
    if (uVar16 != 0) {
      do {
        iVar10 = local_7c + 1;
        if (pbVar9->ptr_[uVar16 - 1] != '0') {
          uVar22 = pbVar9->capacity_;
          if (uVar22 < uVar16) {
            (*pbVar9->grow_)(pbVar9,uVar16);
            uVar22 = pbVar9->capacity_;
          }
          goto LAB_001e44d3;
        }
        uVar16 = uVar16 - 1;
        local_7c = iVar10;
      } while (uVar16 != 0);
    }
    uVar22 = pbVar9->capacity_;
    uVar16 = 0;
LAB_001e44d3:
    if (uVar16 < uVar22) {
      uVar22 = uVar16;
    }
    pbVar9->size_ = uVar22;
  }
  return local_7c;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision,
                                  const format_specs& specs, bool binary32,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  auto converted_value = convert_float(value);

  const bool fixed = specs.type() == presentation_type::fixed;
  if (value == 0) {
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>() || is_constant_evaluated()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    auto e = (f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10;
    exp = static_cast<int>(e);
    if (e > exp) ++exp;  // Compute ceil.
    dragon_flags = dragon::fixup;
  } else {
    // Extract significand bits and exponent bits.
    using info = dragonbox::float_info<double>;
    auto br = bit_cast<uint64_t>(static_cast<double>(value));

    const uint64_t significand_mask =
        (static_cast<uint64_t>(1) << num_significand_bits<double>()) - 1;
    uint64_t significand = (br & significand_mask);
    int exponent = static_cast<int>((br & exponent_mask<double>()) >>
                                    num_significand_bits<double>());

    if (exponent != 0) {  // Check if normal.
      exponent -= exponent_bias<double>() + num_significand_bits<double>();
      significand |=
          (static_cast<uint64_t>(1) << num_significand_bits<double>());
      significand <<= 1;
    } else {
      // Normalize subnormal inputs.
      FMT_ASSERT(significand != 0, "zeros should not appear here");
      int shift = countl_zero(significand);
      FMT_ASSERT(shift >= num_bits<uint64_t>() - num_significand_bits<double>(),
                 "");
      shift -= (num_bits<uint64_t>() - num_significand_bits<double>() - 2);
      exponent = (std::numeric_limits<double>::min_exponent -
                  num_significand_bits<double>()) -
                 shift;
      significand <<= shift;
    }

    // Compute the first several nonzero decimal significand digits.
    // We call the number we get the first segment.
    const int k = info::kappa - dragonbox::floor_log10_pow2(exponent);
    exp = -k;
    const int beta = exponent + dragonbox::floor_log2_pow10(k);
    uint64_t first_segment;
    bool has_more_segments;
    int digits_in_the_first_segment;
    {
      const auto r = dragonbox::umul192_upper128(
          significand << beta, dragonbox::get_cached_power(k));
      first_segment = r.high();
      has_more_segments = r.low() != 0;

      // The first segment can have 18 ~ 19 digits.
      if (first_segment >= 1000000000000000000ULL) {
        digits_in_the_first_segment = 19;
      } else {
        // When it is of 18-digits, we align it to 19-digits by adding a bogus
        // zero at the end.
        digits_in_the_first_segment = 18;
        first_segment *= 10;
      }
    }

    // Compute the actual number of decimal digits to print.
    if (fixed) adjust_precision(precision, exp + digits_in_the_first_segment);

    // Use Dragon4 only when there might be not enough digits in the first
    // segment.
    if (digits_in_the_first_segment > precision) {
      use_dragon = false;

      if (precision <= 0) {
        exp += digits_in_the_first_segment;

        if (precision < 0) {
          // Nothing to do, since all we have are just leading zeros.
          buf.try_resize(0);
        } else {
          // We may need to round-up.
          buf.try_resize(1);
          if ((first_segment | static_cast<uint64_t>(has_more_segments)) >
              5000000000000000000ULL) {
            buf[0] = '1';
          } else {
            buf[0] = '0';
          }
        }
      }  // precision <= 0
      else {
        exp += digits_in_the_first_segment - precision;

        // When precision > 0, we divide the first segment into three
        // subsegments, each with 9, 9, and 0 ~ 1 digits so that each fits
        // in 32-bits which usually allows faster calculation than in
        // 64-bits. Since some compiler (e.g. MSVC) doesn't know how to optimize
        // division-by-constant for large 64-bit divisors, we do it here
        // manually. The magic number 7922816251426433760 below is equal to
        // ceil(2^(64+32) / 10^10).
        const uint32_t first_subsegment = static_cast<uint32_t>(
            dragonbox::umul128_upper64(first_segment, 7922816251426433760ULL) >>
            32);
        const uint64_t second_third_subsegments =
            first_segment - first_subsegment * 10000000000ULL;

        uint64_t prod;
        uint32_t digits;
        bool should_round_up;
        int number_of_digits_to_print = min_of(precision, 9);

        // Print a 9-digits subsegment, either the first or the second.
        auto print_subsegment = [&](uint32_t subsegment, char* buffer) {
          int number_of_digits_printed = 0;

          // If we want to print an odd number of digits from the subsegment,
          if ((number_of_digits_to_print & 1) != 0) {
            // Convert to 64-bit fixed-point fractional form with 1-digit
            // integer part. The magic number 720575941 is a good enough
            // approximation of 2^(32 + 24) / 10^8; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(720575941)) >> 24) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            *buffer = static_cast<char>('0' + digits);
            number_of_digits_printed++;
          }
          // If we want to print an even number of digits from the
          // first_subsegment,
          else {
            // Convert to 64-bit fixed-point fractional form with 2-digits
            // integer part. The magic number 450359963 is a good enough
            // approximation of 2^(32 + 20) / 10^7; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(450359963)) >> 20) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            write2digits(buffer, digits);
            number_of_digits_printed += 2;
          }

          // Print all digit pairs.
          while (number_of_digits_printed < number_of_digits_to_print) {
            prod = static_cast<uint32_t>(prod) * static_cast<uint64_t>(100);
            digits = static_cast<uint32_t>(prod >> 32);
            write2digits(buffer + number_of_digits_printed, digits);
            number_of_digits_printed += 2;
          }
        };

        // Print first subsegment.
        print_subsegment(first_subsegment, buf.data());

        // Perform rounding if the first subsegment is the last subsegment to
        // print.
        if (precision <= 9) {
          // Rounding inside the subsegment.
          // We round-up if:
          //  - either the fractional part is strictly larger than 1/2, or
          //  - the fractional part is exactly 1/2 and the last digit is odd.
          // We rely on the following observations:
          //  - If fractional_part >= threshold, then the fractional part is
          //    strictly larger than 1/2.
          //  - If the MSB of fractional_part is set, then the fractional part
          //    must be at least 1/2.
          //  - When the MSB of fractional_part is set, either
          //    second_third_subsegments being nonzero or has_more_segments
          //    being true means there are further digits not printed, so the
          //    fractional part is strictly larger than 1/2.
          if (precision < 9) {
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (second_third_subsegments != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          // In this case, the fractional part is at least 1/2 if and only if
          // second_third_subsegments >= 5000000000ULL, and is strictly larger
          // than 1/2 if we further have either second_third_subsegments >
          // 5000000000ULL or has_more_segments == true.
          else {
            should_round_up = second_third_subsegments > 5000000000ULL ||
                              (second_third_subsegments == 5000000000ULL &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }
        // Otherwise, print the second subsegment.
        else {
          // Compilers are not aware of how to leverage the maximum value of
          // second_third_subsegments to find out a better magic number which
          // allows us to eliminate an additional shift. 1844674407370955162 =
          // ceil(2^64/10) < ceil(2^64*(10^9/(10^10 - 1))).
          const uint32_t second_subsegment =
              static_cast<uint32_t>(dragonbox::umul128_upper64(
                  second_third_subsegments, 1844674407370955162ULL));
          const uint32_t third_subsegment =
              static_cast<uint32_t>(second_third_subsegments) -
              second_subsegment * 10;

          number_of_digits_to_print = precision - 9;
          print_subsegment(second_subsegment, buf.data() + 9);

          // Rounding inside the subsegment.
          if (precision < 18) {
            // The condition third_subsegment != 0 implies that the segment was
            // of 19 digits, so in this case the third segment should be
            // consisting of a genuine digit from the input.
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (third_subsegment != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          else {
            // In this case, the segment must be of 19 digits, thus
            // the third subsegment should be consisting of a genuine digit from
            // the input.
            should_round_up = third_subsegment > 5 ||
                              (third_subsegment == 5 &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }

        // Round-up if necessary.
        if (should_round_up) {
          ++buf[precision - 1];
          for (int i = precision - 1; i > 0 && buf[i] > '9'; --i) {
            buf[i] = '0';
            ++buf[i - 1];
          }
          if (buf[0] > '9') {
            buf[0] = '1';
            if (fixed)
              buf[precision++] = '0';
            else
              ++exp;
          }
        }
        buf.try_resize(to_unsigned(precision));
      }
    }  // if (digits_in_the_first_segment > precision)
    else {
      // Adjust the exponent for its use in Dragon4.
      exp += digits_in_the_first_segment - 1;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = binary32 ? f.assign(static_cast<float>(value))
                                          : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.alt()) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}